

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void copyvalue(MOJOSHADER_effectValue *dst,MOJOSHADER_effectValue *src,MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  MOJOSHADER_symbolClass MVar2;
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  
  if (src->name != (char *)0x0) {
    sVar3 = strlen(src->name);
    pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
    strcpy(pcVar4,src->name);
    dst->name = pcVar4;
  }
  if (src->semantic != (char *)0x0) {
    sVar3 = strlen(src->semantic);
    pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
    strcpy(pcVar4,src->semantic);
    dst->semantic = pcVar4;
  }
  copysymboltypeinfo(&dst->type,&src->type,m,d);
  uVar1 = src->value_count;
  dst->value_count = uVar1;
  MVar2 = (dst->type).parameter_class;
  if (MOJOSHADER_SYMCLASS_MATRIX_COLUMNS < MVar2) {
    if (MVar2 == MOJOSHADER_SYMCLASS_OBJECT) {
      if ((dst->type).parameter_type - MOJOSHADER_SYMTYPE_SAMPLER < 5) {
        pvVar5 = (*m)(uVar1 * 0x48,d);
        (dst->field_4).values = pvVar5;
        memset(pvVar5,0,(ulong)(uVar1 * 0x48));
        lVar7 = 8;
        for (uVar6 = 0; uVar6 < dst->value_count; uVar6 = uVar6 + 1) {
          *(undefined4 *)((long)(dst->field_4).values + lVar7 + -8) =
               *(undefined4 *)((long)(src->field_4).values + lVar7 + -8);
          copyvalue((MOJOSHADER_effectValue *)((long)(dst->field_4).values + lVar7),
                    (MOJOSHADER_effectValue *)((long)(src->field_4).values + lVar7),m,d);
          lVar7 = lVar7 + 0x48;
        }
        return;
      }
    }
    else if (MVar2 != MOJOSHADER_SYMCLASS_STRUCT) {
      return;
    }
  }
  pvVar5 = (*m)(uVar1 << 2,d);
  (dst->field_4).values = pvVar5;
  memcpy(pvVar5,(src->field_4).values,(ulong)(uVar1 << 2));
  return;
}

Assistant:

void copyvalue(MOJOSHADER_effectValue *dst,
               MOJOSHADER_effectValue *src,
               MOJOSHADER_malloc m,
               void *d)
{
    int i;
    uint32 siz = 0;
    char *stringcopy = NULL;

    COPY_STRING(name)
    COPY_STRING(semantic)
    copysymboltypeinfo(&dst->type, &src->type, m, d);
    dst->value_count = src->value_count;

    if (dst->type.parameter_class == MOJOSHADER_SYMCLASS_SCALAR
     || dst->type.parameter_class == MOJOSHADER_SYMCLASS_VECTOR
     || dst->type.parameter_class == MOJOSHADER_SYMCLASS_MATRIX_ROWS
     || dst->type.parameter_class == MOJOSHADER_SYMCLASS_MATRIX_COLUMNS
     || dst->type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
    {
        siz = dst->value_count * 4;
        dst->values = m(siz, d);
        // !!! FIXME: Out of memory check!
        memcpy(dst->values, src->values, siz);
    } // if
    else if (dst->type.parameter_class == MOJOSHADER_SYMCLASS_OBJECT)
    {
        if (dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER
         || dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D
         || dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D
         || dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D
         || dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            siz = dst->value_count * sizeof (MOJOSHADER_effectSamplerState);
            dst->values = m(siz, d);
            // !!! FIXME: Out of memory check!
            memset(dst->values, '\0', siz);
            for (i = 0; i < dst->value_count; i++)
            {
                dst->valuesSS[i].type = src->valuesSS[i].type;
                copyvalue(&dst->valuesSS[i].value,
                          &src->valuesSS[i].value,
                          m, d);
            } // for
        } // if
        else
        {
            siz = dst->value_count * 4;
            dst->values = m(siz, d);
            // !!! FIXME: Out of memory check!
            memcpy(dst->values, src->values, siz);
        } // else
    } // else if

}